

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.cc
# Opt level: O2

bool __thiscall ToOpEdge::operator<(ToOpEdge *this,ToOpEdge *op2)

{
  uint uVar1;
  uint uVar2;
  PcodeOp *pPVar3;
  PcodeOp *pPVar4;
  bool bVar5;
  
  pPVar3 = this->op;
  pPVar4 = op2->op;
  if (((pPVar3->start).pc.base == (pPVar4->start).pc.base) &&
     ((pPVar3->start).pc.offset == (pPVar4->start).pc.offset)) {
    uVar2 = (pPVar3->start).order;
    uVar1 = (pPVar4->start).order;
    bVar5 = uVar2 < uVar1;
    if (uVar2 == uVar1) {
      bVar5 = this->slot < op2->slot;
    }
    return bVar5;
  }
  bVar5 = Address::operator<(&(pPVar3->start).pc,&(pPVar4->start).pc);
  return bVar5;
}

Assistant:

bool ToOpEdge::operator<(const ToOpEdge &op2) const

{
  const Address &addr1( op->getSeqNum().getAddr() );
  const Address &addr2( op2.op->getSeqNum().getAddr() );
  if (addr1 != addr2)
    return (addr1 < addr2);
  uintm ord1 = op->getSeqNum().getOrder();
  uintm ord2 = op2.op->getSeqNum().getOrder();
  if (ord1 != ord2)
    return (ord1 < ord2);
  return (slot < op2.slot);
}